

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_avx2.c
# Opt level: O1

void uavs3d_if_ver_chroma_w8_avx2
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  undefined2 uVar1;
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if (height != 0) {
    lVar2 = (long)i_src;
    uVar1 = *(undefined2 *)(coeff + 2);
    auVar3._2_2_ = uVar1;
    auVar3._0_2_ = uVar1;
    auVar3._4_2_ = uVar1;
    auVar3._6_2_ = uVar1;
    auVar3._8_2_ = uVar1;
    auVar3._10_2_ = uVar1;
    auVar3._12_2_ = uVar1;
    auVar3._14_2_ = uVar1;
    auVar3._16_2_ = uVar1;
    auVar3._18_2_ = uVar1;
    auVar3._20_2_ = uVar1;
    auVar3._22_2_ = uVar1;
    auVar3._24_2_ = uVar1;
    auVar3._26_2_ = uVar1;
    auVar3._28_2_ = uVar1;
    auVar3._30_2_ = uVar1;
    uVar1 = *(undefined2 *)coeff;
    auVar4._2_2_ = uVar1;
    auVar4._0_2_ = uVar1;
    auVar4._4_2_ = uVar1;
    auVar4._6_2_ = uVar1;
    auVar4._8_2_ = uVar1;
    auVar4._10_2_ = uVar1;
    auVar4._12_2_ = uVar1;
    auVar4._14_2_ = uVar1;
    auVar4._16_2_ = uVar1;
    auVar4._18_2_ = uVar1;
    auVar4._20_2_ = uVar1;
    auVar4._22_2_ = uVar1;
    auVar4._24_2_ = uVar1;
    auVar4._26_2_ = uVar1;
    auVar4._28_2_ = uVar1;
    auVar4._30_2_ = uVar1;
    auVar5._8_2_ = 0x20;
    auVar5._0_8_ = 0x20002000200020;
    auVar5._10_2_ = 0x20;
    auVar5._12_2_ = 0x20;
    auVar5._14_2_ = 0x20;
    auVar5._16_2_ = 0x20;
    auVar5._18_2_ = 0x20;
    auVar5._20_2_ = 0x20;
    auVar5._22_2_ = 0x20;
    auVar5._24_2_ = 0x20;
    auVar5._26_2_ = 0x20;
    auVar5._28_2_ = 0x20;
    auVar5._30_2_ = 0x20;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)src;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((long)src - lVar2);
      auVar7._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar6;
      auVar7._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)((long)src + (i_src * 2 - lVar2));
      auVar9._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar8;
      auVar9._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
      auVar7 = vpunpcklbw_avx2(auVar7,auVar9);
      auVar7 = vpmaddubsw_avx2(auVar7,auVar4);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)((long)src + (i_src * 3 - lVar2));
      auVar10._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar11;
      auVar10._16_16_ = ZEXT116(1) * auVar14;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)((long)src + (i_src * 4 - lVar2));
      auVar12._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar14;
      auVar12._16_16_ = ZEXT116(1) * auVar13;
      auVar9 = vpunpcklbw_avx2(auVar10,auVar12);
      auVar9 = vpmaddubsw_avx2(auVar9,auVar3);
      auVar7 = vpaddw_avx2(auVar7,auVar9);
      auVar7 = vpaddw_avx2(auVar7,auVar5);
      auVar7 = vpsraw_avx2(auVar7,6);
      auVar6 = vpackuswb_avx(auVar7._16_16_,auVar7._16_16_);
      auVar8 = vpackuswb_avx(auVar7._0_16_,auVar7._0_16_);
      *(long *)dst = auVar8._0_8_;
      *(long *)(dst + i_dst) = auVar6._0_8_;
      dst = dst + i_dst * 2;
      src = (pel *)((long)src + (long)(i_src * 2));
      height = height + -2;
    } while (height != 0);
  }
  return;
}

Assistant:

void uavs3d_if_ver_chroma_w8_avx2(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff, int max_val)
{
    const int offset = 32;
    const int shift = 6;
    __m256i mAddOffset = _mm256_set1_epi16(offset);
    const int i_src2 = i_src * 2;
    const int i_src3 = i_src * 3;
    const int i_src4 = i_src * 4;
    __m256i coeff0 = _mm256_set1_epi16(*(s16*)coeff);
    __m256i coeff1 = _mm256_set1_epi16(*(s16*)(coeff + 2));
    __m256i T0, T1, mVal;
    __m256i S0, S1, S2, S3;
    __m128i s0, s1, s2, s3, s4;

    src -= i_src;

    while (height) {
        s0 = _mm_loadl_epi64((__m128i*)(src));
        s1 = _mm_loadl_epi64((__m128i*)(src + i_src));
        s2 = _mm_loadl_epi64((__m128i*)(src + i_src2));
        s3 = _mm_loadl_epi64((__m128i*)(src + i_src3));
        s4 = _mm_loadl_epi64((__m128i*)(src + i_src4));

        src += 2 * i_src;
        height -= 2;
        uavs3d_prefetch(src + i_src3, _MM_HINT_NTA);
        uavs3d_prefetch(src + i_src4, _MM_HINT_NTA);

        S0 = _mm256_set_m128i(s1, s0);
        S1 = _mm256_set_m128i(s2, s1);
        S2 = _mm256_set_m128i(s3, s2);
        S3 = _mm256_set_m128i(s4, s3);

        S0 = _mm256_unpacklo_epi8(S0, S1);
        S2 = _mm256_unpacklo_epi8(S2, S3);

        T0 = _mm256_maddubs_epi16(S0, coeff0);
        T1 = _mm256_maddubs_epi16(S2, coeff1);

        mVal = _mm256_add_epi16(T0, T1);

        mVal = _mm256_add_epi16(mVal, mAddOffset);
        mVal = _mm256_srai_epi16(mVal, shift);
        s0 = _mm_packus_epi16(_mm256_castsi256_si128(mVal), _mm256_extracti128_si256(mVal, 1));

        _mm_storel_epi64((__m128i*)(dst), s0);
        _mm_storeh_pi((__m64*)(dst + i_dst), _mm_castsi128_ps(s0));

        dst += 2 * i_dst;
    }
}